

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalSlot.h
# Opt level: O1

void __thiscall
Signal<std::function<void(std::shared_ptr<SocketClient>const&,String_const&,unsigned_short,Buffer&&)>>
::operator()(Signal<std::function<void(std::shared_ptr<SocketClient>const&,String_const&,unsigned_short,Buffer&&)>>
             *this,shared_ptr<SocketClient> *args,String *args_1,unsigned_short *args_2,
            Buffer *args_3)

{
  int iVar1;
  _Base_ptr p_Var2;
  map<unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>_>_>_>
  conn;
  unsigned_short local_62;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)(this + 8));
  if (iVar1 != 0) {
LAB_00163fa2:
    std::__throw_system_error(iVar1);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>_>_>_>
  ::operator=(&local_60,
              (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>_>_>_>
               *)(this + 0x30));
  pthread_mutex_unlock((pthread_mutex_t *)(this + 8));
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_62 = *args_2;
      if (p_Var2[1]._M_right == (_Base_ptr)0x0) {
        iVar1 = std::__throw_bad_function_call();
        goto LAB_00163fa2;
      }
      (**(code **)(p_Var2 + 2))(&p_Var2[1]._M_parent,args,args_1,&local_62,args_3);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void operator()(Args&&... args)
    {
        std::map<Key, Signature> conn;
        {
            std::lock_guard<std::mutex> locker(mutex);
            conn = connections;
        }
        for (auto& connection : conn) {
            connection.second(std::forward<Args>(args)...);
        }
    }